

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::DropDirectoryItem(cmComputeLinkInformation *this,string *item)

{
  ostream *poVar1;
  ostringstream e;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"WARNING: Target \"",0x11)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->Target->Name)._M_dataplus._M_p,
                      (this->Target->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\" requests linking to directory \"",0x21);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(item->_M_dataplus)._M_p,item->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".  ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Targets may link only to libraries.  ",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CMake is dropping the item.",0x1b);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message((char *)local_1b0,(char *)0x0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(std::string const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  std::ostringstream e;
  e << "WARNING: Target \"" << this->Target->GetName()
    << "\" requests linking to directory \"" << item << "\".  "
    << "Targets may link only to libraries.  "
    << "CMake is dropping the item.";
  cmSystemTools::Message(e.str().c_str());
}